

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::SPxMainSM<double>::DuplicateRowsPS::DuplicateRowsPS
          (DuplicateRowsPS *this,SPxLPBase<double> *lp,int _i,int maxLhsIdx,int minRhsIdx,
          DSVectorBase<double> *dupRows,Array<double> *scale,DataArray<int> *perm,
          DataArray<bool> *isLhsEqualRhs,bool isTheLast,bool isFixedRow,
          shared_ptr<soplex::Tolerances> *tols,bool isFirst)

{
  int **p;
  pointer pdVar1;
  double dVar2;
  int iVar3;
  SPxSense SVar4;
  element_type *peVar5;
  Nonzero<double> *pNVar6;
  double dVar7;
  int iVar8;
  int n;
  long lVar9;
  long lVar10;
  undefined4 uVar11;
  uint uVar12;
  undefined8 local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar5 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  iVar3 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar8 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_003b1a18;
  (this->super_PostStep).m_name = "DuplicateRows";
  (this->super_PostStep).nCols = iVar8;
  (this->super_PostStep).nRows = iVar3;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_38);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__DuplicateRowsPS_003b2300;
  this->m_i = _i;
  SVar4 = lp->thesense;
  dVar2 = (lp->super_LPRowSetBase<double>).object.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[_i];
  uVar12 = (uint)((ulong)dVar2 >> 0x20);
  if (SVar4 == MINIMIZE) {
    uVar12 = uVar12 ^ 0x80000000;
  }
  this->m_i_rowObj = (double)CONCAT44(uVar12,SUB84(dVar2,0));
  this->m_maxLhsIdx = maxLhsIdx;
  this->m_minRhsIdx = minRhsIdx;
  this->m_maxSense = SVar4 == MAXIMIZE;
  this->m_isFirst = isFirst;
  this->m_isLast = isTheLast;
  this->m_fixed = isFixedRow;
  this->m_nCols = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar3 = (dupRows->super_SVectorBase<double>).memused;
  (this->m_scale).super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
  (this->m_scale).super_SVectorBase<double>.memsize = 0;
  (this->m_scale).super_SVectorBase<double>.memused = 0;
  (this->m_scale)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b0660;
  (this->m_scale).theelem = (Nonzero<double> *)0x0;
  if (iVar3 < 1) {
    iVar3 = 2;
  }
  spx_alloc<soplex::Nonzero<double>*>(&(this->m_scale).theelem,iVar3);
  (this->m_scale).super_SVectorBase<double>.m_elem = (this->m_scale).theelem;
  (this->m_scale).super_SVectorBase<double>.memused = 0;
  (this->m_scale).super_SVectorBase<double>.memsize = iVar3;
  iVar3 = (dupRows->super_SVectorBase<double>).memused;
  (this->m_rowObj).super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
  (this->m_rowObj).super_SVectorBase<double>.memsize = 0;
  (this->m_rowObj).super_SVectorBase<double>.memused = 0;
  (this->m_rowObj)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b0660;
  (this->m_rowObj).theelem = (Nonzero<double> *)0x0;
  iVar8 = 2;
  if (0 < iVar3) {
    iVar8 = iVar3;
  }
  spx_alloc<soplex::Nonzero<double>*>(&(this->m_rowObj).theelem,iVar8);
  (this->m_rowObj).super_SVectorBase<double>.m_elem = (this->m_rowObj).theelem;
  (this->m_rowObj).super_SVectorBase<double>.memused = 0;
  (this->m_rowObj).super_SVectorBase<double>.memsize = iVar8;
  iVar3 = (dupRows->super_SVectorBase<double>).memused;
  p = &(this->m_rIdxLocalOld).data;
  (this->m_rIdxLocalOld).data = (int *)0x0;
  (this->m_rIdxLocalOld).memFactor = 1.2;
  iVar8 = 0;
  if (0 < iVar3) {
    iVar8 = iVar3;
  }
  (this->m_rIdxLocalOld).thesize = iVar8;
  n = 1;
  if (0 < iVar3) {
    n = iVar8;
  }
  (this->m_rIdxLocalOld).themax = n;
  spx_alloc<int*>(p,n);
  DataArray<int>::DataArray(&this->m_perm,perm);
  DataArray<bool>::DataArray(&this->m_isLhsEqualRhs,isLhsEqualRhs);
  if (0 < (dupRows->super_SVectorBase<double>).memused) {
    dVar2 = (scale->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[_i];
    lVar9 = 8;
    lVar10 = 0;
    do {
      iVar3 = *(int *)((long)&((dupRows->super_SVectorBase<double>).m_elem)->val + lVar9);
      dVar7 = dVar2 / (scale->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar3];
      DSVectorBase<double>::makeMem(&this->m_scale,1);
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        iVar8 = (this->m_scale).super_SVectorBase<double>.memused;
        pNVar6 = (this->m_scale).super_SVectorBase<double>.m_elem;
        pNVar6[iVar8].idx = iVar3;
        pNVar6[iVar8].val = dVar7;
        (this->m_scale).super_SVectorBase<double>.memused = iVar8 + 1;
      }
      iVar3 = *(int *)((long)&((dupRows->super_SVectorBase<double>).m_elem)->val + lVar9);
      if (lp->thesense == MINIMIZE) {
        pdVar1 = (lp->super_LPRowSetBase<double>).object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start + iVar3;
        uVar11 = *(undefined4 *)pdVar1;
        uVar12 = *(uint *)((long)pdVar1 + 4) ^ 0x80000000;
      }
      else {
        dVar7 = (lp->super_LPRowSetBase<double>).object.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar3];
        uVar11 = SUB84(dVar7,0);
        uVar12 = (uint)((ulong)dVar7 >> 0x20);
      }
      local_88 = (double)CONCAT44(uVar12,uVar11);
      DSVectorBase<double>::makeMem(&this->m_rowObj,1);
      if ((local_88 != 0.0) || (NAN(local_88))) {
        iVar8 = (this->m_rowObj).super_SVectorBase<double>.memused;
        pNVar6 = (this->m_rowObj).super_SVectorBase<double>.m_elem;
        pNVar6[iVar8].idx = iVar3;
        pNVar6[iVar8].val = local_88;
        (this->m_rowObj).super_SVectorBase<double>.memused = iVar8 + 1;
      }
      (*p)[lVar10] = *(int *)((long)&((dupRows->super_SVectorBase<double>).m_elem)->val + lVar9);
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar10 < (dupRows->super_SVectorBase<double>).memused);
  }
  return;
}

Assistant:

DuplicateRowsPS(const SPxLPBase<R>& lp, int _i,
                      int maxLhsIdx, int minRhsIdx, const DSVectorBase<R>& dupRows,
                      const Array<R> scale, const DataArray<int> perm, const DataArray<bool> isLhsEqualRhs,
                      bool isTheLast, bool isFixedRow, std::shared_ptr<Tolerances> tols, bool isFirst = false)
         : PostStep("DuplicateRows", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_i_rowObj(lp.rowObj(_i))
         , m_maxLhsIdx((maxLhsIdx == -1) ? -1 : maxLhsIdx)
         , m_minRhsIdx((minRhsIdx == -1) ? -1 : minRhsIdx)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_isFirst(isFirst)
         , m_isLast(isTheLast)
         , m_fixed(isFixedRow)
         , m_nCols(lp.nCols())
         , m_scale(dupRows.size())
         , m_rowObj(dupRows.size())
         , m_rIdxLocalOld(dupRows.size())
         , m_perm(perm)
         , m_isLhsEqualRhs(isLhsEqualRhs)
      {
         R rowScale = scale[_i];

         for(int k = 0; k < dupRows.size(); ++k)
         {
            m_scale.add(dupRows.index(k), rowScale / scale[dupRows.index(k)]);
            m_rowObj.add(dupRows.index(k), lp.rowObj(dupRows.index(k)));
            m_rIdxLocalOld[k] = dupRows.index(k);
         }
      }